

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O3

void filemgr_dirty_update_free(filemgr *file)

{
  filemgr *file_00;
  filemgr *pfVar1;
  filemgr *node;
  
  file_00 = (filemgr *)avl_first(&file->dirty_update_idx);
  while (file_00 != (filemgr *)0x0) {
    pfVar1 = (filemgr *)avl_next((avl_node *)file_00);
    node = file_00;
    avl_remove(&file->dirty_update_idx,(avl_node *)file_00);
    _filemgr_dirty_update_remove_node(file_00,(filemgr_dirty_update_node *)node);
    file_00 = pfVar1;
  }
  pthread_spin_destroy(&file->dirty_update_lock);
  return;
}

Assistant:

void filemgr_dirty_update_free(struct filemgr *file)
{
    struct avl_node *a = avl_first(&file->dirty_update_idx);
    struct filemgr_dirty_update_node *node;

    while (a) {
        node = _get_entry(a, struct filemgr_dirty_update_node, avl);
        a = avl_next(a);
        avl_remove(&file->dirty_update_idx, &node->avl);
        _filemgr_dirty_update_remove_node(file, node);
    }
    spin_destroy(&file->dirty_update_lock);
}